

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O1

void testChlistHelper(exr_context_t f)

{
  int iVar1;
  exr_result_t eVar2;
  exr_attr_chlist_entry_t *peVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  char *in_RCX;
  char *pcVar7;
  _internal_exr_context *pctxt;
  exr_attr_chlist_t local_38;
  exr_attr_chlist_t cl2;
  
  local_38.num_channels = 0;
  local_38.num_alloced = 0;
  local_38.entries = (exr_attr_chlist_entry_t *)0x0;
  exr_attr_chlist_destroy(f,&local_38);
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(f + 0x40))(f,3,"Invalid channel list pointer to chlist_add_with_length");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_init (f, __null, 0)",(char *)0x222,0x1807bd,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    in_RCX = (char *)0xffffffff;
    iVar1 = (**(code **)(f + 0x48))(f,3,"Negative number of channels requested (%d)");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_init (f, &cl, -1)",(char *)0x225,0x1807bd,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_init (f, &cl, 0)",(char *)0x226,0x1807bd,in_RCX);
  }
  local_38.num_channels = 0;
  local_38.num_alloced = 0;
  local_38.entries = (exr_attr_chlist_entry_t *)0x0;
  exr_attr_chlist_destroy(f,&local_38);
  s_malloc_fail_on = 1;
  local_38.num_channels = 0;
  local_38.num_alloced = 0;
  local_38.entries = (exr_attr_chlist_entry_t *)0x0;
  peVar3 = (exr_attr_chlist_entry_t *)(**(code **)(f + 0x58))(0x60);
  if (peVar3 == (exr_attr_chlist_entry_t *)0x0) {
    iVar1 = (**(code **)(f + 0x38))(f,1);
  }
  else {
    local_38.num_alloced = 3;
    iVar1 = 0;
    local_38.entries = peVar3;
  }
  s_malloc_fail_on = 0;
  if (iVar1 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_init (f, &cl, 3)",(char *)0x22d,0x1807bd,in_RCX);
  }
  exr_attr_chlist_destroy(f,&local_38);
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(f + 0x40))(f,3,"Invalid channel list pointer to chlist_add_with_length");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, __null, \"foo\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x243,0x1807bd,in_RCX);
  }
  pcVar7 = (char *)0x3;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"foo",3,EXR_PIXEL_LAST_TYPE,EXR_PERCEPTUALLY_LOGARITHMIC,1,1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"foo\", EXR_PIXEL_LAST_TYPE, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x24d,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x3;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"foo",3,~EXR_PIXEL_UINT,EXR_PERCEPTUALLY_LOGARITHMIC,1,1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"foo\", (exr_pixel_type_t) -1, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x257,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x3;
  eVar2 = exr_attr_chlist_add_with_length(f,&local_38,"foo",3,EXR_PIXEL_HALF,2,1,1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"foo\", EXR_PIXEL_HALF, (exr_perceptual_treatment_t) 2, 1, 1)"
                   ,(char *)0x261,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x3;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"foo",3,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,0,1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"foo\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 0, 1)"
                   ,(char *)0x265,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x3;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"foo",3,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,-1,1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"foo\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, -1, 1)"
                   ,(char *)0x26f,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x3;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"foo",3,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,1,0);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"foo\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 0)"
                   ,(char *)0x273,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x3;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"foo",3,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LINEAR,1,-1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"foo\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, -1)"
                   ,(char *)0x277,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x3;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"foo",3,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LINEAR,1,2);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"foo\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 2)"
                   ,(char *)0x27a,0x1807bd,pcVar7);
  }
  if (local_38.num_channels != 1) {
    core_test_fail("cl.num_channels == 1",(char *)0x27b,0x1807bd,pcVar7);
  }
  iVar1 = strcmp(((local_38.entries)->name).str,"foo");
  if (iVar1 != 0) {
    core_test_fail("0 == strcmp (cl.entries[0].name.str, \"foo\")",(char *)0x27c,0x1807bd,pcVar7);
  }
  if ((local_38.entries)->pixel_type != EXR_PIXEL_HALF) {
    core_test_fail("cl.entries[0].pixel_type == EXR_PIXEL_HALF",(char *)0x27d,0x1807bd,pcVar7);
  }
  if ((local_38.entries)->p_linear != '\x01') {
    core_test_fail("cl.entries[0].p_linear == (uint8_t) EXR_PERCEPTUALLY_LINEAR",(char *)0x27e,
                   0x1807bd,pcVar7);
  }
  if ((local_38.entries)->x_sampling != 1) {
    core_test_fail("cl.entries[0].x_sampling == 1",(char *)0x27f,0x1807bd,pcVar7);
  }
  if ((local_38.entries)->y_sampling != 2) {
    core_test_fail("cl.entries[0].y_sampling == 2",(char *)0x280,0x1807bd,pcVar7);
  }
  eVar2 = exr_attr_chlist_destroy(f,&local_38);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_destroy (f, &cl)",(char *)0x281,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x0;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"",0,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LINEAR,1,1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1)"
                   ,(char *)0x286,0x1807bd,pcVar7);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    pcVar7 = "<NULL>";
    iVar1 = (**(code **)(f + 0x48))(f,3,"Channel name must not be empty, received \'%s\'");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, __null, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1)"
                   ,(char *)0x28a,0x1807bd,pcVar7);
  }
  if (f == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    pcVar7 = "R";
    iVar1 = (**(code **)(f + 0x48))(f,3,"Channel name must not be empty, received \'%s\'");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add_with_length ( f, &cl, \"R\", 0, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1)"
                   ,(char *)0x28f,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x400;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"R",0x400,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LINEAR,1,1);
  if (eVar2 != 0xc) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(0xc);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add_with_length ( f, &cl, \"R\", 1024, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1)"
                   ,(char *)0x293,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x1;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"R",1,EXR_PIXEL_LAST_TYPE,EXR_PERCEPTUALLY_LINEAR,1,1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add_with_length ( f, &cl, \"R\", 1, EXR_PIXEL_LAST_TYPE, EXR_PERCEPTUALLY_LINEAR, 1, 1)"
                   ,(char *)0x29e,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x1;
  eVar2 = exr_attr_chlist_add_with_length(f,&local_38,"R",1,EXR_PIXEL_HALF,7,1,1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add_with_length ( f, &cl, \"R\", 1, EXR_PIXEL_HALF, (exr_perceptual_treatment_t) 7, 1, 1)"
                   ,(char *)0x2a9,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x1;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"R",1,EXR_PIXEL_FLOAT,EXR_PERCEPTUALLY_LOGARITHMIC,0,1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add_with_length ( f, &cl, \"R\", 1, EXR_PIXEL_FLOAT, EXR_PERCEPTUALLY_LOGARITHMIC, 0, 1)"
                   ,(char *)0x2b4,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x1;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"R",1,EXR_PIXEL_UINT,EXR_PERCEPTUALLY_LOGARITHMIC,1,-1);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add_with_length ( f, &cl, \"R\", 1, EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, 1, -1)"
                   ,(char *)0x2bf,0x1807bd,pcVar7);
  }
  s_malloc_fail_on = 1;
  pcVar7 = (char *)0x1;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"R",1,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,1,1);
  s_malloc_fail_on = 0;
  if (eVar2 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add_with_length ( f, &cl, \"R\", 1, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x2ca,0x1807bd,pcVar7);
  }
  s_malloc_fail_on = 2;
  pcVar7 = (char *)0x1;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"R",1,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,1,1);
  s_malloc_fail_on = 0;
  if (eVar2 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add_with_length ( f, &cl, \"R\", 1, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x2d6,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x1;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"R",1,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,1,1);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"R\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x2d9,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x1;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"G",1,EXR_PIXEL_FLOAT,EXR_PERCEPTUALLY_LOGARITHMIC,1,1);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, &cl, \"G\", EXR_PIXEL_FLOAT, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x2db,0x1807bd,pcVar7);
  }
  pcVar7 = (char *)0x1;
  eVar2 = exr_attr_chlist_add_with_length
                    (f,&local_38,"B",1,EXR_PIXEL_UINT,EXR_PERCEPTUALLY_LOGARITHMIC,1,1);
  if (eVar2 == 0) {
    if (local_38.num_channels != 3) {
      core_test_fail("cl.num_channels == 3",(char *)0x2de,0x1807bd,pcVar7);
    }
    iVar1 = strcmp(((local_38.entries)->name).str,"B");
    if (iVar1 != 0) {
      core_test_fail("0 == strcmp (cl.entries[0].name.str, \"B\")",(char *)0x2df,0x1807bd,pcVar7);
    }
    iVar1 = strcmp(local_38.entries[1].name.str,"G");
    if (iVar1 != 0) {
      core_test_fail("0 == strcmp (cl.entries[1].name.str, \"G\")",(char *)0x2e0,0x1807bd,pcVar7);
    }
    iVar1 = strcmp(local_38.entries[2].name.str,"R");
    if (iVar1 != 0) {
      core_test_fail("0 == strcmp (cl.entries[2].name.str, \"R\")",(char *)0x2e1,0x1807bd,pcVar7);
    }
    pcVar7 = (char *)0x1;
    eVar2 = exr_attr_chlist_add_with_length
                      (f,&local_38,"B",1,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,1,1);
    if (eVar2 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(3);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_chlist_add ( f, &cl, \"B\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                     ,(char *)0x2e6,0x1807bd,pcVar7);
    }
    if (local_38.num_channels != 3) {
      core_test_fail("cl.num_channels == 3",(char *)0x2e7,0x1807bd,pcVar7);
    }
    cl2.num_channels = 0;
    cl2.num_alloced = 0;
    cl2.entries = (exr_attr_chlist_entry_t *)0x0;
    eVar2 = exr_attr_chlist_duplicate((exr_context_t)0x0,&cl2,&local_38);
    if (eVar2 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_chlist_duplicate (__null, &cl2, &cl)",(char *)0x2ec,0x1807bd,pcVar7);
    }
    eVar2 = exr_attr_chlist_duplicate(f,&cl2,&local_38);
    if (eVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_chlist_duplicate (f, &cl2, &cl)",(char *)0x2f1,0x1807bd,pcVar7);
    }
    if (cl2.num_channels != 3) {
      core_test_fail("cl2.num_channels == 3",(char *)0x2f2,0x1807bd,pcVar7);
    }
    iVar1 = strcmp(((cl2.entries)->name).str,"B");
    if (iVar1 != 0) {
      core_test_fail("0 == strcmp (cl2.entries[0].name.str, \"B\")",(char *)0x2f3,0x1807bd,pcVar7);
    }
    iVar1 = strcmp(cl2.entries[1].name.str,"G");
    if (iVar1 != 0) {
      core_test_fail("0 == strcmp (cl2.entries[1].name.str, \"G\")",(char *)0x2f4,0x1807bd,pcVar7);
    }
    iVar1 = strcmp(cl2.entries[2].name.str,"R");
    if (iVar1 != 0) {
      core_test_fail("0 == strcmp (cl2.entries[2].name.str, \"R\")",(char *)0x2f5,0x1807bd,pcVar7);
    }
    eVar2 = exr_attr_chlist_destroy(f,&cl2);
    if (eVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_chlist_destroy (f, &cl2)",(char *)0x2f6,0x1807bd,pcVar7);
    }
    s_malloc_fail_on = 2;
    eVar2 = exr_attr_chlist_duplicate(f,&cl2,&local_38);
    s_malloc_fail_on = 0;
    if (eVar2 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_chlist_duplicate (f, &cl2, &cl)",(char *)0x2f8,0x1807bd,pcVar7);
    }
    eVar2 = exr_attr_chlist_destroy(f,&cl2);
    if (eVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_chlist_destroy (f, &cl2)",(char *)0x2f9,0x1807bd,pcVar7);
    }
    pcVar7 = (char *)0x20;
    eVar2 = exr_attr_chlist_add_with_length
                      (f,&local_38,"reallongreallongreallonglongname",0x20,EXR_PIXEL_HALF,
                       EXR_PERCEPTUALLY_LOGARITHMIC,1,1);
    if (eVar2 != 0xc) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(0xc);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_chlist_add ( f, &cl, \"reallongreallongreallonglongname\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                     ,(char *)0x305,0x1807bd,pcVar7);
    }
    eVar2 = exr_attr_chlist_destroy(f,&local_38);
    if (eVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_chlist_destroy (f, &cl)",(char *)0x306,0x1807bd,pcVar7);
    }
    eVar2 = exr_attr_chlist_destroy(f,&local_38);
    if (eVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_attr_chlist_destroy (f, &cl)",(char *)0x309,0x1807bd,pcVar7);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
  pcVar5 = (char *)exr_get_default_error_message(eVar2);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  core_test_fail("exr_attr_chlist_add ( f, &cl, \"B\", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                 ,(char *)0x2dd,0x1807bd,pcVar7);
}

Assistant:

static void
testChlistHelper (exr_context_t f)
{
    exr_attr_chlist_t cl = {0};

    exr_attr_chlist_destroy (f, NULL);
    exr_attr_chlist_destroy (f, &cl);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_chlist_init (NULL, NULL, 0));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_chlist_init (f, NULL, 0));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_chlist_init (f, &cl, -1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_init (f, &cl, 0));
    exr_attr_chlist_destroy (f, &cl);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_chlist_destroy (NULL, &cl));

    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_chlist_init (f, &cl, 3));
    exr_attr_chlist_destroy (f, &cl);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_chlist_add (
            NULL,
            &cl,
            "foo",
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            NULL,
            "foo",
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            &cl,
            "foo",
            EXR_PIXEL_LAST_TYPE,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            &cl,
            "foo",
            (exr_pixel_type_t) -1,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            &cl,
            "foo",
            EXR_PIXEL_HALF,
            (exr_perceptual_treatment_t) 2,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "foo", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 0, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f,
            &cl,
            "foo",
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            -1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "foo", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 0));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "foo", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, -1));

    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f, &cl, "foo", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 2));
    EXRCORE_TEST (cl.num_channels == 1);
    EXRCORE_TEST (0 == strcmp (cl.entries[0].name.str, "foo"));
    EXRCORE_TEST (cl.entries[0].pixel_type == EXR_PIXEL_HALF);
    EXRCORE_TEST (cl.entries[0].p_linear == (uint8_t) EXR_PERCEPTUALLY_LINEAR);
    EXRCORE_TEST (cl.entries[0].x_sampling == 1);
    EXRCORE_TEST (cl.entries[0].y_sampling == 2);
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, NULL, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f, &cl, "R", 0, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_chlist_add_with_length (
            f, &cl, "R", 1024, EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LINEAR, 1, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_LAST_TYPE,
            EXR_PERCEPTUALLY_LINEAR,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_HALF,
            (exr_perceptual_treatment_t) 7,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_FLOAT,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            0,
            1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_UINT,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            -1));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL_FAIL_MALLOC_AFTER (
        1,
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_chlist_add_with_length (
            f,
            &cl,
            "R",
            1,
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));

    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f, &cl, "R", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f, &cl, "G", EXR_PIXEL_FLOAT, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f, &cl, "B", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST (cl.num_channels == 3);
    EXRCORE_TEST (0 == strcmp (cl.entries[0].name.str, "B"));
    EXRCORE_TEST (0 == strcmp (cl.entries[1].name.str, "G"));
    EXRCORE_TEST (0 == strcmp (cl.entries[2].name.str, "R"));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_chlist_add (
            f, &cl, "B", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST (cl.num_channels == 3);

    exr_attr_chlist_t cl2 = {0};
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_chlist_duplicate (NULL, &cl2, &cl));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_chlist_duplicate (f, NULL, &cl));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_chlist_duplicate (f, &cl2, NULL));
    EXRCORE_TEST_RVAL (exr_attr_chlist_duplicate (f, &cl2, &cl));
    EXRCORE_TEST (cl2.num_channels == 3);
    EXRCORE_TEST (0 == strcmp (cl2.entries[0].name.str, "B"));
    EXRCORE_TEST (0 == strcmp (cl2.entries[1].name.str, "G"));
    EXRCORE_TEST (0 == strcmp (cl2.entries[2].name.str, "R"));
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl2));
    EXRCORE_TEST_RVAL_FAIL_MALLOC_AFTER (
        1, EXR_ERR_OUT_OF_MEMORY, exr_attr_chlist_duplicate (f, &cl2, &cl));
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl2));

    /* without a file, max will be 31 */
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_chlist_add (
            f,
            &cl,
            "reallongreallongreallonglongname",
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            1,
            1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl));

    // make sure we can re-delete something?
    EXRCORE_TEST_RVAL (exr_attr_chlist_destroy (f, &cl));
}